

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

string * from_errno_abi_cxx11_(void)

{
  int *piVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_d0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_11;
  string *out;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"syserror{code = ",&local_99);
  piVar1 = __errno_location();
  std::__cxx11::to_string(&local_d0,*piVar1);
  std::operator+(&local_78,&local_98,&local_d0);
  std::operator+(&local_58,&local_78,", msg = ");
  piVar1 = __errno_location();
  __rhs = strerror(*piVar1);
  std::operator+(&local_38,&local_58,__rhs);
  std::operator+(in_RDI,&local_38,"}");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return in_RDI;
}

Assistant:

std::string from_errno() {
  std::string out = std::string("syserror{code = ") + std::to_string(errno) + ", msg = " + strerror(errno) + "}";
  return out;
}